

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O3

shared_ptr<duckdb::CSVBufferHandle,_true> __thiscall
duckdb::CSVBuffer::Pin(CSVBuffer *this,CSVFileHandle *file_handle,bool *has_seeked)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BufferManager *pBVar1;
  BlockHandle *pBVar2;
  undefined1 *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::CSVBufferHandle,_true> sVar3;
  undefined1 local_51;
  CSVBufferHandle *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  BufferHandle local_40;
  
  pBVar1 = BufferManager::GetBufferManager
                     (*(ClientContext **)
                       ((long)&(file_handle->main_mutex).super___mutex_base._M_mutex + 8));
  if (file_handle->field_0x29 == '\0') {
    pBVar2 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                       ((shared_ptr<duckdb::BlockHandle,_true> *)&file_handle->encoder);
    if ((pBVar2->state)._M_i == BLOCK_UNLOADED) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (file_handle->encoder).encoding_name._M_string_length;
      (file_handle->encoder).encoding_name._M_dataplus._M_p = (pointer)0x0;
      (file_handle->encoder).encoding_name._M_string_length = 0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      Reload((CSVBuffer *)file_handle,(CSVFileHandle *)has_seeked);
      *in_RCX = 1;
    }
  }
  (*pBVar1->_vptr_BufferManager[7])(&local_40,pBVar1,&file_handle->encoder);
  local_50 = (CSVBufferHandle *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVBufferHandle,std::allocator<duckdb::CSVBufferHandle>,duckdb::BufferHandle,unsigned_long&,unsigned_long&,bool&,unsigned_long&>
            (&local_48,&local_50,(allocator<duckdb::CSVBufferHandle> *)&local_51,&local_40,
             (unsigned_long *)&(file_handle->main_mutex).super___mutex_base._M_mutex.__data.__kind,
             (unsigned_long *)((file_handle->main_mutex).super___mutex_base._M_mutex.__size + 0x18),
             (bool *)file_handle,(unsigned_long *)&file_handle->file_handle);
  *(CSVBufferHandle **)this = local_50;
  this->context = (ClientContext *)local_48._M_pi;
  if ((ClientContext *)local_48._M_pi != (ClientContext *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_48._M_pi)->_M_use_count)->_M_pi
           = *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_48._M_pi)->_M_use_count)
                      ->_M_pi + 1;
      UNLOCK();
      if ((ClientContext *)local_48._M_pi == (ClientContext *)0x0) goto LAB_016576f9;
    }
    else {
      *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_48._M_pi)->_M_use_count)->_M_pi
           = *(int *)&((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(local_48._M_pi)->_M_use_count)
                      ->_M_pi + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
LAB_016576f9:
  BufferHandle::~BufferHandle(&local_40);
  sVar3.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::CSVBufferHandle,_true>)
         sVar3.internal.super___shared_ptr<duckdb::CSVBufferHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CSVBufferHandle> CSVBuffer::Pin(CSVFileHandle &file_handle, bool &has_seeked) {
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	if (!is_pipe && block->IsUnloaded()) {
		// We have to reload it from disk
		block = nullptr;
		Reload(file_handle);
		has_seeked = true;
	}
	return make_shared_ptr<CSVBufferHandle>(buffer_manager.Pin(block), actual_buffer_size, requested_size, last_buffer,
	                                        buffer_idx);
}